

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

int __thiscall
vkt::QueryPool::QueryPoolStatisticsTests::init(QueryPoolStatisticsTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  _Alloc_hider _Var2;
  int iVar3;
  TestCaseGroup *pTVar4;
  TestNode *pTVar5;
  ostream *poVar6;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
  *pQVar7;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
  *pQVar8;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
  *pQVar9;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
  *pQVar10;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
  *pQVar11;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
  *pQVar12;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
  *pQVar13;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayTestInstance>
  *pQVar14;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
  *pQVar15;
  int shaderNdx_1;
  allocator<char> *paVar16;
  ParametersGraphic in_R8;
  allocator<char> *paVar17;
  char *pcVar18;
  int shaderNdx;
  long lVar19;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> secondaryInherited;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> secondary;
  string local_410 [32];
  TestNode *local_3f0;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> geometryShaderPrimitives;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> geometryShaderInvocations;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> fragmentShaderInvocations;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> vertexShaderInvocations;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> inputAssemblyPrimitives;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> inputAssemblyVertices;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> computeShaderInvocationsGroup
  ;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
  tesEvaluationShaderInvocations;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> tesControlPatches;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> clippingPrimitives;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> clippingInvocations;
  undefined1 *local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined4 local_318;
  ostringstream shaderName;
  string topology_name [11];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)topology_name,"point_list",(allocator<char> *)&shaderName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(topology_name + 1),"line_list",(allocator<char> *)&secondary);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(topology_name + 2),"line_strip",(allocator<char> *)&secondaryInherited);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(topology_name + 3),"triangle_list",(allocator<char> *)&local_338);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(topology_name + 4),"triangle_strip",
             (allocator<char> *)&computeShaderInvocationsGroup);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(topology_name + 5),"triangle_fan",(allocator<char> *)&inputAssemblyVertices)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(topology_name + 6),"line_list_with_adjacency",
             (allocator<char> *)&inputAssemblyPrimitives);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(topology_name + 7),"line_strip_with_adjacency",
             (allocator<char> *)&vertexShaderInvocations);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(topology_name + 8),"triangle_list_with_adjacency",
             (allocator<char> *)&fragmentShaderInvocations);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(topology_name + 9),"triangle_strip_with_adjacency",
             (allocator<char> *)&geometryShaderInvocations);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(topology_name + 10),"patch_list",
             (allocator<char> *)&geometryShaderPrimitives);
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "compute_shader_invocations","Query pipeline statistic compute shader invocations");
  computeShaderInvocationsGroup.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"input_assembly_vertices",
             "Query pipeline statistic input assembly vertices");
  inputAssemblyVertices.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"input_assembly_primitives"
             ,"Query pipeline statistic input assembly primitives");
  inputAssemblyPrimitives.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"vertex_shader_invocations"
             ,"Query pipeline statistic vertex shader invocation");
  vertexShaderInvocations.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "fragment_shader_invocations","Query pipeline statistic fragment shader invocation");
  fragmentShaderInvocations.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "geometry_shader_invocations","Query pipeline statistic geometry shader invocation");
  geometryShaderInvocations.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "geometry_shader_primitives","Query pipeline statistic geometry shader primitives");
  geometryShaderPrimitives.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"clipping_invocations",
             "Query pipeline statistic clipping invocations");
  clippingInvocations.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"clipping_primitives",
             "Query pipeline statistic clipping primitives");
  clippingPrimitives.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"tes_control_patches",
             "Query pipeline statistic tessellation control shader patches");
  tesControlPatches.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "tes_evaluation_shader_invocations",
             "Query pipeline statistic tessellation evaluation shader invocations");
  local_3f0 = &(computeShaderInvocationsGroup.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
               .ptr)->super_TestNode;
  tesEvaluationShaderInvocations.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar4;
  pTVar5 = (TestNode *)operator_new(0x88);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  paVar17 = (allocator<char> *)&secondaryInherited;
  std::__cxx11::string::string<std::allocator<char>>((string *)&shaderName,"primary",paVar17);
  paVar16 = (allocator<char> *)&local_338;
  std::__cxx11::string::string<std::allocator<char>>((string *)&secondary,"",paVar16);
  TestCase::TestCase((TestCase *)pTVar5,pTVar1,(string *)&shaderName,(string *)&secondary);
  std::__cxx11::string::~string((string *)&secondary);
  std::__cxx11::string::~string((string *)&shaderName);
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__QueryPoolStatisticsTest_00c042f8;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar5[1]._vptr_TestNode = (_func_int **)0x0;
  pTVar5[1].m_testCtx = (TestContext *)0x0;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)&DAT_200000002;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data._8_8_ = 0x100000002;
  local_338 = &DAT_200000002;
  uStack_330 = 0x300000002;
  local_328 = 0x300000007;
  uStack_320 = 0x100000001;
  local_318 = 1;
  for (lVar19 = 0; lVar19 != 3; lVar19 = lVar19 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderName);
    poVar6 = std::operator<<((ostream *)&shaderName,"compute_");
    std::ostream::operator<<(poVar6,(int)lVar19);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)&secondary,(Vector<unsigned_int,_3> *)paVar17);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)
               &secondary.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xc,(Vector<unsigned_int,_3> *)paVar16);
    std::__cxx11::stringbuf::str();
    std::
    vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
    ::push_back((vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                 *)(pTVar5 + 1),(value_type *)&secondary);
    std::__cxx11::string::~string(local_410);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderName);
    paVar16 = paVar16 + 0xc;
    paVar17 = paVar17 + 0xc;
  }
  tcu::TestNode::addChild(local_3f0,pTVar5);
  local_3f0 = &(computeShaderInvocationsGroup.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
               .ptr)->super_TestNode;
  pTVar5 = (TestNode *)operator_new(0x88);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  paVar17 = (allocator<char> *)&secondaryInherited;
  std::__cxx11::string::string<std::allocator<char>>((string *)&shaderName,"secondary",paVar17);
  paVar16 = (allocator<char> *)&local_338;
  std::__cxx11::string::string<std::allocator<char>>((string *)&secondary,"",paVar16);
  TestCase::TestCase((TestCase *)pTVar5,pTVar1,(string *)&shaderName,(string *)&secondary);
  std::__cxx11::string::~string((string *)&secondary);
  std::__cxx11::string::~string((string *)&shaderName);
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__QueryPoolStatisticsTest_00c043c0;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar5[1]._vptr_TestNode = (_func_int **)0x0;
  pTVar5[1].m_testCtx = (TestContext *)0x0;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)&DAT_200000002;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data._8_8_ = 0x100000002;
  local_338 = &DAT_200000002;
  uStack_330 = 0x300000002;
  local_328 = 0x300000007;
  uStack_320 = 0x100000001;
  local_318 = 1;
  for (lVar19 = 0; lVar19 != 3; lVar19 = lVar19 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderName);
    poVar6 = std::operator<<((ostream *)&shaderName,"compute_");
    std::ostream::operator<<(poVar6,(int)lVar19);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)&secondary,(Vector<unsigned_int,_3> *)paVar17);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)
               &secondary.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xc,(Vector<unsigned_int,_3> *)paVar16);
    std::__cxx11::stringbuf::str();
    std::
    vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
    ::push_back((vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                 *)(pTVar5 + 1),(value_type *)&secondary);
    std::__cxx11::string::~string(local_410);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderName);
    paVar16 = paVar16 + 0xc;
    paVar17 = paVar17 + 0xc;
  }
  tcu::TestNode::addChild(local_3f0,pTVar5);
  local_3f0 = &(computeShaderInvocationsGroup.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
               .ptr)->super_TestNode;
  pTVar5 = (TestNode *)operator_new(0x88);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  paVar17 = (allocator<char> *)&secondaryInherited;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderName,"secondary_inherited",paVar17);
  paVar16 = (allocator<char> *)&local_338;
  std::__cxx11::string::string<std::allocator<char>>((string *)&secondary,"",paVar16);
  TestCase::TestCase((TestCase *)pTVar5,pTVar1,(string *)&shaderName,(string *)&secondary);
  std::__cxx11::string::~string((string *)&secondary);
  std::__cxx11::string::~string((string *)&shaderName);
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__QueryPoolStatisticsTest_00c04478;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar5[1]._vptr_TestNode = (_func_int **)0x0;
  pTVar5[1].m_testCtx = (TestContext *)0x0;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)&DAT_200000002;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data._8_8_ = 0x100000002;
  local_338 = &DAT_200000002;
  uStack_330 = 0x300000002;
  local_328 = 0x300000007;
  uStack_320 = 0x100000001;
  local_318 = 1;
  for (lVar19 = 0; lVar19 != 3; lVar19 = lVar19 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderName);
    poVar6 = std::operator<<((ostream *)&shaderName,"compute_");
    std::ostream::operator<<(poVar6,(int)lVar19);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)&secondary,(Vector<unsigned_int,_3> *)paVar17);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)
               &secondary.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xc,(Vector<unsigned_int,_3> *)paVar16);
    std::__cxx11::stringbuf::str();
    std::
    vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
    ::push_back((vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                 *)(pTVar5 + 1),(value_type *)&secondary);
    std::__cxx11::string::~string(local_410);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderName);
    paVar16 = paVar16 + 0xc;
    paVar17 = paVar17 + 0xc;
  }
  tcu::TestNode::addChild(local_3f0,pTVar5);
  pTVar4 = inputAssemblyVertices.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pQVar7 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
            *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>::
  QueryPoolGraphicStatisticsTest
            (pQVar7,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             (char *)0x400000001,in_R8);
  tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar7);
  pTVar4 = inputAssemblyVertices.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pQVar8 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
            *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary",
             (char *)0x400000001,in_R8);
  tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar8);
  pTVar4 = inputAssemblyVertices.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pQVar9 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
            *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar9,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary_inherited",
             (char *)0x400000001,in_R8);
  tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar9);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  _shaderName = (pointer)pTVar5;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary","");
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary_inherited","");
  pcVar18 = (char *)0x2;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar4;
  for (lVar19 = 0; _Var2._M_p = _shaderName, lVar19 != 0x140; lVar19 = lVar19 + 0x20) {
    pQVar7 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar7,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild((TestNode *)_Var2._M_p,(TestNode *)pQVar7);
    pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    pQVar8 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar8);
    pTVar4 = secondaryInherited.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pQVar9 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar9,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar9);
    pcVar18 = pcVar18 + 0x100000000;
  }
  _shaderName = (pointer)0x0;
  tcu::TestNode::addChild
            (&(inputAssemblyPrimitives.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,(TestNode *)_Var2._M_p);
  pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(inputAssemblyPrimitives.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  pTVar4 = secondaryInherited.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(inputAssemblyPrimitives.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondaryInherited.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondary.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&shaderName)
  ;
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  _shaderName = (pointer)pTVar5;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary","");
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary_inherited","");
  pcVar18 = (char *)0x4;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar4;
  for (lVar19 = 0; _Var2._M_p = _shaderName, lVar19 != 0x140; lVar19 = lVar19 + 0x20) {
    pQVar7 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar7,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild((TestNode *)_Var2._M_p,(TestNode *)pQVar7);
    pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    pQVar8 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar8);
    pTVar4 = secondaryInherited.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pQVar9 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar9,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar9);
    pcVar18 = pcVar18 + 0x100000000;
  }
  _shaderName = (pointer)0x0;
  tcu::TestNode::addChild
            (&(vertexShaderInvocations.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,(TestNode *)_Var2._M_p);
  pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(vertexShaderInvocations.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  pTVar4 = secondaryInherited.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(vertexShaderInvocations.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondaryInherited.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondary.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&shaderName)
  ;
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  _shaderName = (pointer)pTVar5;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary","");
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary_inherited","");
  pcVar18 = (char *)0x80;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar4;
  for (lVar19 = 0; _Var2._M_p = _shaderName, lVar19 != 0x140; lVar19 = lVar19 + 0x20) {
    pQVar7 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar7,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild((TestNode *)_Var2._M_p,(TestNode *)pQVar7);
    pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    pQVar8 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar8);
    pTVar4 = secondaryInherited.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pQVar9 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
              *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar9,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar9);
    pcVar18 = pcVar18 + 0x100000000;
  }
  _shaderName = (pointer)0x0;
  tcu::TestNode::addChild
            (&(fragmentShaderInvocations.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,(TestNode *)_Var2._M_p);
  pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(fragmentShaderInvocations.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  pTVar4 = secondaryInherited.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(fragmentShaderInvocations.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondaryInherited.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondary.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&shaderName)
  ;
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  _shaderName = (pointer)pTVar5;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary","");
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary_inherited","");
  pcVar18 = (char *)0x8;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar4;
  for (lVar19 = 0; _Var2._M_p = _shaderName, lVar19 != 0x140; lVar19 = lVar19 + 0x20) {
    pQVar10 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
               *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar10,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild((TestNode *)_Var2._M_p,(TestNode *)pQVar10);
    pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    pQVar11 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
               *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar11,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar11);
    pTVar4 = secondaryInherited.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pQVar12 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
               *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar12,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar12);
    pcVar18 = pcVar18 + 0x100000000;
  }
  _shaderName = (pointer)0x0;
  tcu::TestNode::addChild
            (&(geometryShaderInvocations.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,(TestNode *)_Var2._M_p);
  pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(geometryShaderInvocations.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  pTVar4 = secondaryInherited.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(geometryShaderInvocations.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondaryInherited.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondary.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&shaderName)
  ;
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  _shaderName = (pointer)pTVar5;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary","");
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary_inherited","");
  pcVar18 = (char *)0x10;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar4;
  for (lVar19 = 0; _Var2._M_p = _shaderName, lVar19 != 0x140; lVar19 = lVar19 + 0x20) {
    pQVar10 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
               *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar10,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild((TestNode *)_Var2._M_p,(TestNode *)pQVar10);
    pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    pQVar11 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
               *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar11,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar11);
    pTVar4 = secondaryInherited.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pQVar12 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
               *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar12,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar12);
    pcVar18 = pcVar18 + 0x100000000;
  }
  _shaderName = (pointer)0x0;
  tcu::TestNode::addChild
            (&(geometryShaderPrimitives.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,(TestNode *)_Var2._M_p);
  pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(geometryShaderPrimitives.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  pTVar4 = secondaryInherited.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(geometryShaderPrimitives.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondaryInherited.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondary.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&shaderName)
  ;
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  _shaderName = (pointer)pTVar5;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary","");
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary_inherited","");
  pcVar18 = (char *)0x20;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar4;
  for (lVar19 = 0; _Var2._M_p = _shaderName, lVar19 != 0x140; lVar19 = lVar19 + 0x20) {
    pQVar10 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
               *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar10,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild((TestNode *)_Var2._M_p,(TestNode *)pQVar10);
    pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    pQVar11 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
               *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar11,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar11);
    pTVar4 = secondaryInherited.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pQVar12 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
               *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar12,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar12);
    pcVar18 = pcVar18 + 0x100000000;
  }
  _shaderName = (pointer)0x0;
  tcu::TestNode::addChild
            (&(clippingInvocations.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,(TestNode *)_Var2._M_p);
  pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(clippingInvocations.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  pTVar4 = secondaryInherited.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(clippingInvocations.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondaryInherited.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondary.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&shaderName)
  ;
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"primary",
             "");
  _shaderName = (pointer)pTVar5;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary","");
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"secondary_inherited","");
  pcVar18 = (char *)0x40;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar4;
  for (lVar19 = 0; _Var2._M_p = _shaderName, lVar19 != 0x140; lVar19 = lVar19 + 0x20) {
    pQVar10 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
               *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar10,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild((TestNode *)_Var2._M_p,(TestNode *)pQVar10);
    pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    pQVar11 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
               *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar11,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar11);
    pTVar4 = secondaryInherited.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pQVar12 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
               *)operator_new(0x90);
    QueryPool::anon_unknown_0::
    QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
    ::QueryPoolGraphicStatisticsTest
              (pQVar12,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(char **)((long)&topology_name[0]._M_dataplus._M_p + lVar19),pcVar18,in_R8);
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar12);
    pcVar18 = pcVar18 + 0x100000000;
  }
  _shaderName = (pointer)0x0;
  tcu::TestNode::addChild
            (&(clippingPrimitives.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,(TestNode *)_Var2._M_p);
  pTVar4 = secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  secondary.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(clippingPrimitives.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  pTVar4 = secondaryInherited.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  secondaryInherited.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(clippingPrimitives.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondaryInherited.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&secondary.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&shaderName)
  ;
  pTVar4 = tesControlPatches.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pQVar13 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
             *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar13,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"tes_control_patches",
             (char *)0x400000100,in_R8);
  tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar13);
  pTVar4 = tesControlPatches.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pQVar14 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayTestInstance>
             *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar14,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "tes_control_patches_secondary",(char *)0x400000100,in_R8);
  tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar14);
  pTVar4 = tesControlPatches.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pQVar15 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
             *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar15,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "tes_control_patches_secondary_inherited",(char *)0x400000100,in_R8);
  tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar15);
  pTVar4 = tesEvaluationShaderInvocations.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pQVar13 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
             *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar13,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "tes_evaluation_shader_invocations",(char *)0x400000200,in_R8);
  tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar13);
  pTVar4 = tesEvaluationShaderInvocations.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pQVar14 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayTestInstance>
             *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar14,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "tes_evaluation_shader_invocations_secondary",(char *)0x400000200,in_R8);
  tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar14);
  pTVar4 = tesEvaluationShaderInvocations.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pQVar15 = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
             *)operator_new(0x90);
  QueryPool::anon_unknown_0::
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
  ::QueryPoolGraphicStatisticsTest
            (pQVar15,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "tes_evaluation_shader_invocations_secondary_inherited",(char *)0x400000200,in_R8);
  tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pQVar15);
  pTVar4 = computeShaderInvocationsGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  computeShaderInvocationsGroup.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild((TestNode *)this,&pTVar4->super_TestNode);
  pTVar4 = inputAssemblyVertices.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  inputAssemblyVertices.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild((TestNode *)this,&pTVar4->super_TestNode);
  pTVar4 = inputAssemblyPrimitives.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  inputAssemblyPrimitives.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild((TestNode *)this,&pTVar4->super_TestNode);
  pTVar4 = vertexShaderInvocations.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  vertexShaderInvocations.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild((TestNode *)this,&pTVar4->super_TestNode);
  pTVar4 = fragmentShaderInvocations.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  fragmentShaderInvocations.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild((TestNode *)this,&pTVar4->super_TestNode);
  pTVar4 = geometryShaderInvocations.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  geometryShaderInvocations.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild((TestNode *)this,&pTVar4->super_TestNode);
  pTVar4 = geometryShaderPrimitives.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  geometryShaderPrimitives.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild((TestNode *)this,&pTVar4->super_TestNode);
  pTVar4 = clippingInvocations.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  clippingInvocations.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild((TestNode *)this,&pTVar4->super_TestNode);
  pTVar4 = clippingPrimitives.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  clippingPrimitives.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild((TestNode *)this,&pTVar4->super_TestNode);
  pTVar4 = tesControlPatches.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  tesControlPatches.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild((TestNode *)this,&pTVar4->super_TestNode);
  pTVar4 = tesEvaluationShaderInvocations.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  tesEvaluationShaderInvocations.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild((TestNode *)this,&pTVar4->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&tesEvaluationShaderInvocations.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&tesControlPatches.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&clippingPrimitives.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&clippingInvocations.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&geometryShaderPrimitives.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&geometryShaderInvocations.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&fragmentShaderInvocations.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&vertexShaderInvocations.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&inputAssemblyPrimitives.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&inputAssemblyVertices.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&computeShaderInvocationsGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  lVar19 = 0x140;
  do {
    iVar3 = std::__cxx11::string::~string
                      ((string *)((long)&topology_name[0]._M_dataplus._M_p + lVar19));
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x20);
  return iVar3;
}

Assistant:

void QueryPoolStatisticsTests::init (void)
{
	std::string topology_name [VK_PRIMITIVE_TOPOLOGY_LAST] =
	{
		"point_list",
		"line_list",
		"line_strip",
		"triangle_list",
		"triangle_strip",
		"triangle_fan",
		"line_list_with_adjacency",
		"line_strip_with_adjacency",
		"triangle_list_with_adjacency",
		"triangle_strip_with_adjacency",
		"patch_list"
	};

	de::MovePtr<TestCaseGroup>	computeShaderInvocationsGroup		(new TestCaseGroup(m_testCtx, "compute_shader_invocations",			"Query pipeline statistic compute shader invocations"));
	de::MovePtr<TestCaseGroup>	inputAssemblyVertices				(new TestCaseGroup(m_testCtx, "input_assembly_vertices",			"Query pipeline statistic input assembly vertices"));
	de::MovePtr<TestCaseGroup>	inputAssemblyPrimitives				(new TestCaseGroup(m_testCtx, "input_assembly_primitives",			"Query pipeline statistic input assembly primitives"));
	de::MovePtr<TestCaseGroup>	vertexShaderInvocations				(new TestCaseGroup(m_testCtx, "vertex_shader_invocations",			"Query pipeline statistic vertex shader invocation"));
	de::MovePtr<TestCaseGroup>	fragmentShaderInvocations			(new TestCaseGroup(m_testCtx, "fragment_shader_invocations",		"Query pipeline statistic fragment shader invocation"));
	de::MovePtr<TestCaseGroup>	geometryShaderInvocations			(new TestCaseGroup(m_testCtx, "geometry_shader_invocations",		"Query pipeline statistic geometry shader invocation"));
	de::MovePtr<TestCaseGroup>	geometryShaderPrimitives			(new TestCaseGroup(m_testCtx, "geometry_shader_primitives",			"Query pipeline statistic geometry shader primitives"));
	de::MovePtr<TestCaseGroup>	clippingInvocations					(new TestCaseGroup(m_testCtx, "clipping_invocations",				"Query pipeline statistic clipping invocations"));
	de::MovePtr<TestCaseGroup>	clippingPrimitives					(new TestCaseGroup(m_testCtx, "clipping_primitives",				"Query pipeline statistic clipping primitives"));
	de::MovePtr<TestCaseGroup>	tesControlPatches					(new TestCaseGroup(m_testCtx, "tes_control_patches",				"Query pipeline statistic tessellation control shader patches"));
	de::MovePtr<TestCaseGroup>	tesEvaluationShaderInvocations		(new TestCaseGroup(m_testCtx, "tes_evaluation_shader_invocations",	"Query pipeline statistic tessellation evaluation shader invocations"));

	computeShaderInvocationsGroup->addChild(new QueryPoolStatisticsTest<ComputeInvocationsTestInstance>						(m_testCtx, "primary",				""));
	computeShaderInvocationsGroup->addChild(new QueryPoolStatisticsTest<ComputeInvocationsSecondaryTestInstance>			(m_testCtx, "secondary",			""));
	computeShaderInvocationsGroup->addChild(new QueryPoolStatisticsTest<ComputeInvocationsSecondaryInheritedTestInstance>	(m_testCtx, "secondary_inherited",	""));

	//VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_VERTICES_BIT
	inputAssemblyVertices->addChild(new QueryPoolGraphicStatisticsTest<VertexShaderTestInstance>					(m_testCtx,	"primary",				"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_VERTICES_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));
	inputAssemblyVertices->addChild(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryTestInstance>			(m_testCtx,	"secondary",			"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_VERTICES_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));
	inputAssemblyVertices->addChild(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryInheritedTestInstance>	(m_testCtx,	"secondary_inherited",	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_VERTICES_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));

	//VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_PRIMITIVES_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<VertexShaderTestInstance>					(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		inputAssemblyPrimitives->addChild(primary.release());
		inputAssemblyPrimitives->addChild(secondary.release());
		inputAssemblyPrimitives->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_VERTEX_SHADER_INVOCATIONS_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<VertexShaderTestInstance>					(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_VERTEX_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_VERTEX_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_VERTEX_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		vertexShaderInvocations->addChild(primary.release());
		vertexShaderInvocations->addChild(secondary.release());
		vertexShaderInvocations->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_FRAGMENT_SHADER_INVOCATIONS_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<VertexShaderTestInstance>					(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_FRAGMENT_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_FRAGMENT_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<VertexShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_FRAGMENT_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		fragmentShaderInvocations->addChild(primary.release());
		fragmentShaderInvocations->addChild(secondary.release());
		fragmentShaderInvocations->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderTestInstance>						(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		geometryShaderInvocations->addChild(primary.release());
		geometryShaderInvocations->addChild(secondary.release());
		geometryShaderInvocations->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderTestInstance>						(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		geometryShaderPrimitives->addChild(primary.release());
		geometryShaderPrimitives->addChild(secondary.release());
		geometryShaderPrimitives->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderTestInstance>						(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		clippingInvocations->addChild(primary.release());
		clippingInvocations->addChild(secondary.release());
		clippingInvocations->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT
	{
		de::MovePtr<TestCaseGroup>	primary				(new TestCaseGroup(m_testCtx, "primary",			""));
		de::MovePtr<TestCaseGroup>	secondary			(new TestCaseGroup(m_testCtx, "secondary",			""));
		de::MovePtr<TestCaseGroup>	secondaryInherited	(new TestCaseGroup(m_testCtx, "secondary_inherited",""));
		for (int topologyNdx = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; topologyNdx < VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++topologyNdx)
		{
			primary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderTestInstance>						(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondary->addChild			(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryTestInstance>			(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
			secondaryInherited->addChild(new QueryPoolGraphicStatisticsTest<GeometryShaderSecondaryInheritedTestInstance>	(m_testCtx,	topology_name[topologyNdx].c_str(),	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT, (VkPrimitiveTopology)topologyNdx)));
		}
		clippingPrimitives->addChild(primary.release());
		clippingPrimitives->addChild(secondary.release());
		clippingPrimitives->addChild(secondaryInherited.release());
	}

	//VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT
	tesControlPatches->addChild(new QueryPoolGraphicStatisticsTest<TessellationShaderTestInstance>					(m_testCtx,	"tes_control_patches",						"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));
	tesControlPatches->addChild(new QueryPoolGraphicStatisticsTest<TessellationShaderSecondrayTestInstance>			(m_testCtx,	"tes_control_patches_secondary",			"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));
	tesControlPatches->addChild(new QueryPoolGraphicStatisticsTest<TessellationShaderSecondrayInheritedTestInstance>(m_testCtx,	"tes_control_patches_secondary_inherited",	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));

	//VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT
	tesEvaluationShaderInvocations->addChild(new QueryPoolGraphicStatisticsTest<TessellationShaderTestInstance>					 (m_testCtx,	"tes_evaluation_shader_invocations",						"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));
	tesEvaluationShaderInvocations->addChild(new QueryPoolGraphicStatisticsTest<TessellationShaderSecondrayTestInstance>		 (m_testCtx,	"tes_evaluation_shader_invocations_secondary",				"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));
	tesEvaluationShaderInvocations->addChild(new QueryPoolGraphicStatisticsTest<TessellationShaderSecondrayInheritedTestInstance>(m_testCtx,	"tes_evaluation_shader_invocations_secondary_inherited",	"",	GraphicBasicTestInstance::ParametersGraphic(VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)));

	addChild(computeShaderInvocationsGroup.release());
	addChild(inputAssemblyVertices.release());
	addChild(inputAssemblyPrimitives.release());
	addChild(vertexShaderInvocations.release());
	addChild(fragmentShaderInvocations.release());
	addChild(geometryShaderInvocations.release());
	addChild(geometryShaderPrimitives.release());
	addChild(clippingInvocations.release());
	addChild(clippingPrimitives.release());
	addChild(tesControlPatches.release());
	addChild(tesEvaluationShaderInvocations.release());
}